

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O1

void __thiscall arangodb::velocypack::Builder::openCompoundValue(Builder *this,uint8_t type)

{
  pointer pCVar1;
  Exception *this_00;
  
  pCVar1 = (this->_stack).
           super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->_stack).
      super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
      ._M_impl.super__Vector_impl_data._M_start != pCVar1) {
    if (this->_keyWritten != true) {
      if ((this->_start[pCVar1[-1].startPos] != '\x06') &&
         (this->_start[pCVar1[-1].startPos] != '\x13')) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        Exception::Exception(this_00,BuilderNeedOpenArray);
        __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
      }
      reportAdd(this);
      addCompoundValue(this,type);
      return;
    }
    this->_keyWritten = false;
  }
  addCompoundValue(this,type);
  return;
}

Assistant:

void openCompoundValue(uint8_t type) {
    if (_stack.empty()) {
      addCompoundValue(type);
    } else if (_keyWritten) {
      _keyWritten = false;
      addCompoundValue(type);
    } else {
      ValueLength const to = _stack.back().startPos;
      if (VELOCYPACK_UNLIKELY(_start[to] != 0x06 && _start[to] != 0x13)) {
        throw Exception(Exception::BuilderNeedOpenArray);
      }
      reportAdd();
      try {
        addCompoundValue(type);
      } catch (...) {
        cleanupAdd();
        throw;
      }
    }
  }